

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_iterator_read(roaring64_iterator_t *it,uint64_t *buf,uint64_t count)

{
  _Bool _Var1;
  ushort uVar2;
  ulong in_RDX;
  long in_RDI;
  uint32_t unaff_retaddr;
  uint64_t *in_stack_00000008;
  uint64_t in_stack_00000010;
  _Bool has_value;
  uint32_t container_count;
  uint16_t low16;
  leaf_t *leaf;
  container_t *in_stack_00000028;
  uint32_t container_consumed;
  uint64_t consumed;
  int iVar3;
  undefined2 in_stack_ffffffffffffffc4;
  uint local_2c;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if ((*(byte *)(in_RDI + 0xa8) & 1) == 0 || in_RDX <= local_28) {
      return local_28;
    }
    uVar2 = (ushort)*(undefined8 *)(in_RDI + 0xa0);
    iVar3 = -1;
    if (in_RDX - local_28 < 0xffffffff) {
      iVar3 = (int)in_RDX - (int)local_28;
    }
    _Var1 = container_iterator_read_into_uint64
                      (in_stack_00000028,leaf._7_1_,_container_count,in_stack_00000010,
                       in_stack_00000008,unaff_retaddr,(uint32_t *)buf,(uint16_t *)it);
    local_28 = local_2c + local_28;
    if (_Var1) break;
    _Var1 = art_iterator_next((art_iterator_t *)0x11325f);
    *(_Bool *)(in_RDI + 0xa8) = _Var1;
    if ((*(byte *)(in_RDI + 0xa8) & 1) != 0) {
      roaring64_iterator_init_at_leaf_first
                ((roaring64_iterator_t *)CONCAT26(uVar2,CONCAT24(in_stack_ffffffffffffffc4,iVar3)));
    }
  }
  *(undefined1 *)(in_RDI + 0xa8) = 1;
  *(ulong *)(in_RDI + 0xa0) = *(ulong *)(in_RDI + 0x98) | (ulong)uVar2;
  return local_28;
}

Assistant:

uint64_t roaring64_iterator_read(roaring64_iterator_t *it, uint64_t *buf,
                                 uint64_t count) {
    uint64_t consumed = 0;
    while (it->has_value && consumed < count) {
        uint32_t container_consumed;
        leaf_t *leaf = (leaf_t *)it->art_it.value;
        uint16_t low16 = (uint16_t)it->value;
        uint32_t container_count = UINT32_MAX;
        if (count - consumed < (uint64_t)UINT32_MAX) {
            container_count = count - consumed;
        }
        bool has_value = container_iterator_read_into_uint64(
            leaf->container, leaf->typecode, &it->container_it, it->high48, buf,
            container_count, &container_consumed, &low16);
        consumed += container_consumed;
        buf += container_consumed;
        if (has_value) {
            it->has_value = true;
            it->value = it->high48 | low16;
            assert(consumed == count);
            return consumed;
        }
        it->has_value = art_iterator_next(&it->art_it);
        if (it->has_value) {
            roaring64_iterator_init_at_leaf_first(it);
        }
    }
    return consumed;
}